

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O1

SegmentBase<Memory::PreReservedVirtualAllocWrapper> * __thiscall
DListBase<Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,RealCount>::
PrependNode<Memory::NoThrowHeapAllocator,Memory::PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>>*,unsigned_long,bool>
          (DListBase<Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,RealCount> *this,
          NoThrowHeapAllocator *allocator,
          PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
          *param1,unsigned_long param2,bool param3)

{
  long lVar1;
  NoThrowHeapAllocator *this_00;
  long *plVar2;
  undefined1 local_68 [8];
  TrackAllocData data;
  
  local_68 = (undefined1  [8])
             &DListNode<Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>>::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_278d72;
  data.filename._0_4_ = 0x131;
  data._32_8_ = param2;
  this_00 = Memory::NoThrowHeapAllocator::TrackAllocInfo(allocator,(TrackAllocData *)local_68);
  plVar2 = (long *)Memory::NoThrowHeapAllocator::Alloc(this_00,0x40);
  Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>::SegmentBase
            ((SegmentBase<Memory::PreReservedVirtualAllocWrapper> *)(plVar2 + 2),param1,data._32_8_,
             param3);
  lVar1 = *(long *)this;
  plVar2[1] = *(long *)(lVar1 + 8);
  *plVar2 = lVar1;
  **(undefined8 **)(lVar1 + 8) = plVar2;
  *(long **)(lVar1 + 8) = plVar2;
  *(int *)(this + 0x10) = *(int *)(this + 0x10) + 1;
  return (SegmentBase<Memory::PreReservedVirtualAllocWrapper> *)(plVar2 + 2);
}

Assistant:

TData * PrependNode(TAllocator * allocator, TParam1 param1, TParam2 param2, TParam3 param3)
    {
        Node * newNode = AllocatorNew(TAllocator, allocator, Node, param1, param2, param3);
        if (newNode)
        {
            DListBase::InsertNodeBefore(this->Next(), newNode);
            this->IncrementCount();
            return &newNode->data;
        }
        return nullptr;
    }